

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall QString::operator=(QString *this,QChar ch)

{
  char16_t *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char16_t __tmp;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar37 [16];
  
  resize(this,1);
  auVar9 = _DAT_004da380;
  auVar8 = _DAT_004da370;
  auVar7 = _DAT_004da360;
  auVar6 = _DAT_004da350;
  auVar5 = _DAT_004d91f0;
  lVar12 = (this->d).size;
  if (lVar12 != 0) {
    pcVar1 = (this->d).ptr;
    uVar10 = lVar12 + 0x7fffffffffffffff;
    uVar11 = uVar10 & 0x7fffffffffffffff;
    auVar13._8_4_ = (int)uVar11;
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = (int)(uVar11 >> 0x20);
    lVar12 = 0;
    auVar13 = auVar13 ^ _DAT_004d91f0;
    do {
      auVar25._8_4_ = (int)lVar12;
      auVar25._0_8_ = lVar12;
      auVar25._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar17 = (auVar25 | auVar9) ^ auVar5;
      iVar26 = auVar13._0_4_;
      iVar32 = -(uint)(iVar26 < auVar17._0_4_);
      iVar14 = auVar13._4_4_;
      auVar18._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar31 = auVar13._8_4_;
      iVar34 = -(uint)(iVar31 < auVar17._8_4_);
      iVar15 = auVar13._12_4_;
      auVar18._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar28._4_4_ = iVar32;
      auVar28._0_4_ = iVar32;
      auVar28._8_4_ = iVar34;
      auVar28._12_4_ = iVar34;
      auVar35 = pshuflw(in_XMM11,auVar28,0xe8);
      auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar37 = pshuflw(in_XMM12,auVar20,0xe8);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar36 = pshuflw(auVar35,auVar18,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar17 = (auVar36 | auVar37 & auVar35) ^ auVar17;
      auVar17 = packssdw(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar1[lVar12] = ch.ucs;
      }
      auVar18 = auVar20 & auVar28 | auVar18;
      auVar17 = packssdw(auVar18,auVar18);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar36,auVar17 ^ auVar36);
      if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
        pcVar1[lVar12 + 1] = ch.ucs;
      }
      auVar17 = (auVar25 | auVar8) ^ auVar5;
      iVar32 = -(uint)(iVar26 < auVar17._0_4_);
      auVar33._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar34 = -(uint)(iVar31 < auVar17._8_4_);
      auVar33._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar19._4_4_ = iVar32;
      auVar19._0_4_ = iVar32;
      auVar19._8_4_ = iVar34;
      auVar19._12_4_ = iVar34;
      auVar27._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar27._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar17 = auVar27 & auVar19 | auVar33;
      auVar17 = packssdw(auVar17,auVar17);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar2,auVar17 ^ auVar2);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar1[lVar12 + 2] = ch.ucs;
      }
      auVar20 = pshufhw(auVar19,auVar19,0x84);
      auVar28 = pshufhw(auVar27,auVar27,0x84);
      auVar18 = pshufhw(auVar20,auVar33,0x84);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar18 | auVar28 & auVar20) ^ auVar21;
      auVar20 = packssdw(auVar21,auVar21);
      if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar1[lVar12 + 3] = ch.ucs;
      }
      auVar20 = (auVar25 | auVar7) ^ auVar5;
      iVar32 = -(uint)(iVar26 < auVar20._0_4_);
      auVar23._4_4_ = -(uint)(iVar14 < auVar20._4_4_);
      iVar34 = -(uint)(iVar31 < auVar20._8_4_);
      auVar23._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
      auVar29._4_4_ = iVar32;
      auVar29._0_4_ = iVar32;
      auVar29._8_4_ = iVar34;
      auVar29._12_4_ = iVar34;
      auVar17 = pshuflw(auVar17,auVar29,0xe8);
      auVar22._4_4_ = -(uint)(auVar20._4_4_ == iVar14);
      auVar22._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      in_XMM12 = pshuflw(auVar37 & auVar35,auVar22,0xe8);
      in_XMM12 = in_XMM12 & auVar17;
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar17 = pshuflw(auVar17,auVar23,0xe8);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar17 | in_XMM12) ^ auVar35;
      in_XMM11 = packssdw(auVar35,auVar35);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar1[lVar12 + 4] = ch.ucs;
      }
      auVar23 = auVar22 & auVar29 | auVar23;
      auVar17 = packssdw(auVar23,auVar23);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
      if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar1[lVar12 + 5] = ch.ucs;
      }
      auVar17 = (auVar25 | auVar6) ^ auVar5;
      iVar26 = -(uint)(iVar26 < auVar17._0_4_);
      auVar30._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar31 = -(uint)(iVar31 < auVar17._8_4_);
      auVar30._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar24._4_4_ = iVar26;
      auVar24._0_4_ = iVar26;
      auVar24._8_4_ = iVar31;
      auVar24._12_4_ = iVar31;
      auVar16._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar16._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar17 = auVar16 & auVar24 | auVar30;
      auVar17 = packssdw(auVar17,auVar17);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar3,auVar17 ^ auVar3);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar1[lVar12 + 6] = ch.ucs;
      }
      auVar25 = pshufhw(auVar24,auVar24,0x84);
      auVar17 = pshufhw(auVar16,auVar16,0x84);
      auVar20 = pshufhw(auVar25,auVar30,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 & auVar25,(auVar20 | auVar17 & auVar25) ^ auVar4);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar1[lVar12 + 7] = ch.ucs;
      }
      lVar12 = lVar12 + 8;
    } while ((uVar11 - ((uint)uVar10 & 7)) + 8 != lVar12);
  }
  return this;
}

Assistant:

QString &QString::operator=(QChar ch)
{
    return assign(1, ch);
}